

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiInApi::setCallback(MidiInApi *this,RtMidiCallback callback,void *userData)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  string local_58;
  string local_38;
  
  if ((this->inputData_).usingCallback == true) {
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiApi).errorString_,0,
               (char *)(this->super_MidiApi).errorString_._M_string_length,0x110972);
    pcVar1 = (this->super_MidiApi).errorString_._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,
               pcVar1 + (this->super_MidiApi).errorString_._M_string_length);
    MidiApi::error(&this->super_MidiApi,WARNING,&local_38);
    local_58.field_2._M_allocated_capacity = local_38.field_2._M_allocated_capacity;
    _Var2._M_p = local_38._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return;
    }
  }
  else {
    if (callback != (RtMidiCallback)0x0) {
      (this->inputData_).userCallback = callback;
      (this->inputData_).userData = userData;
      (this->inputData_).usingCallback = true;
      return;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiApi).errorString_,0,
               (char *)(this->super_MidiApi).errorString_._M_string_length,0x1109ae);
    pcVar1 = (this->super_MidiApi).errorString_._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,
               pcVar1 + (this->super_MidiApi).errorString_._M_string_length);
    MidiApi::error(&this->super_MidiApi,WARNING,&local_58);
    _Var2._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return;
    }
  }
  operator_delete(_Var2._M_p,local_58.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void MidiInApi :: setCallback( RtMidiIn::RtMidiCallback callback, void *userData )
{
  if ( inputData_.usingCallback ) {
    errorString_ = "MidiInApi::setCallback: a callback function is already set!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  if ( !callback ) {
    errorString_ = "RtMidiIn::setCallback: callback function value is invalid!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  inputData_.userCallback = callback;
  inputData_.userData = userData;
  inputData_.usingCallback = true;
}